

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O2

void __thiscall player_t::TickPSprites(player_t *this)

{
  TObjPtr<AActor> *obj;
  APlayerPawn *pAVar1;
  AWeapon *pAVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  DPSprite *this_00;
  AActor *pAVar5;
  APlayerPawn *pAVar6;
  AWeapon *pAVar7;
  DBot *pDVar8;
  undefined4 extraout_var;
  long lVar9;
  TObjPtr<DPSprite> *obj_00;
  undefined8 uStack_38;
  
  obj_00 = &this->psprites;
  uStack_38 = in_RAX;
  do {
    this_00 = GC::ReadBarrier<DPSprite>((DPSprite **)obj_00);
    if (this_00 == (DPSprite *)0x0) {
      pAVar2 = this->ReadyWeapon;
      if (this->health < 1) {
        if (pAVar2 == (AWeapon *)0x0) {
          return;
        }
        if (((pAVar2->super_AInventory).field_0x4de & 4) != 0) {
          return;
        }
      }
      else if (pAVar2 == (AWeapon *)0x0) {
        if (this->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
          return;
        }
        P_BringUpWeapon(this);
        return;
      }
      P_CheckWeaponSwitch(this);
      if ((this->WeaponState & 5) != 0) {
        P_CheckWeaponFire(this);
      }
      pDVar8 = GC::ReadBarrier<DBot>((DBot **)&this->Bot);
      if (((pDVar8 != (DBot *)0x0) || (bot_observer.Value == false)) &&
         (pAVar2 = this->ReadyWeapon, pAVar2 != (AWeapon *)0x0)) {
        for (lVar9 = 0xc; lVar9 != 0x6c; lVar9 = lVar9 + 0x10) {
          if (((*(uint *)(&UNK_006986d8 + lVar9) & (uint)this->WeaponState) != 0) &&
             (((this->cmd).ucmd.buttons & *(uint *)(&UNK_006986dc + lVar9)) != 0)) {
            uStack_38 = CONCAT44(*(undefined4 *)((long)&ButtonChecks[0].ReadyFlag + lVar9),
                                 (undefined4)uStack_38);
            iVar4 = (*(pAVar2->super_AInventory).super_AActor.super_DThinker.super_DObject.
                      _vptr_DObject[0x49])(pAVar2,(long)&uStack_38 + 4);
            if ((FState *)CONCAT44(extraout_var,iVar4) != (FState *)0x0) {
              P_SetPsprite(this,PSP_WEAPON,(FState *)CONCAT44(extraout_var,iVar4),false);
              return;
            }
          }
        }
      }
      return;
    }
    obj = &this_00->Caller;
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar5 == (AActor *)0x0) {
LAB_004c694a:
      (*(this_00->super_DObject)._vptr_DObject[4])(this_00);
    }
    else {
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar3 = DObject::IsKindOf((DObject *)pAVar5,AInventory::RegistrationInfo.MyClass);
      if (bVar3) {
        pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
        pAVar1 = this_00->Owner->mo;
        pAVar6 = (APlayerPawn *)GC::ReadBarrier<AActor>((AActor **)(pAVar5 + 1));
        if (pAVar6 != pAVar1) goto LAB_004c694a;
      }
      pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar3 = DObject::IsKindOf((DObject *)pAVar5,AWeapon::RegistrationInfo.MyClass);
      if ((bVar3) &&
         (pAVar2 = this_00->Owner->ReadyWeapon,
         pAVar7 = (AWeapon *)GC::ReadBarrier<AActor>((AActor **)obj), pAVar7 != pAVar2))
      goto LAB_004c694a;
      DPSprite::Tick(this_00);
    }
    obj_00 = &this_00->Next;
  } while( true );
}

Assistant:

void player_t::TickPSprites()
{
	DPSprite *pspr = psprites;
	while (pspr)
	{
		// Destroy the psprite if it's from a weapon that isn't currently selected by the player
		// or if it's from an inventory item that the player no longer owns. 
		if ((pspr->Caller == nullptr ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AInventory)) && barrier_cast<AInventory *>(pspr->Caller)->Owner != pspr->Owner->mo) ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) && pspr->Caller != pspr->Owner->ReadyWeapon)))
		{
			pspr->Destroy();
		}
		else
		{
			pspr->Tick();
		}

		pspr = pspr->Next;
	}

	if ((health > 0) || (ReadyWeapon != nullptr && !(ReadyWeapon->WeaponFlags & WIF_NODEATHINPUT)))
	{
		if (ReadyWeapon == nullptr)
		{
			if (PendingWeapon != WP_NOCHANGE)
				P_BringUpWeapon(this);
		}
		else
		{
			P_CheckWeaponSwitch(this);
			if (WeaponState & (WF_WEAPONREADY | WF_WEAPONREADYALT))
			{
				P_CheckWeaponFire(this);
			}
			// Check custom buttons
			P_CheckWeaponButtons(this);
		}
	}
}